

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

ExceptionOr<capnp::AnyPointer::Pipeline> * __thiscall
kj::_::ExceptionOr<capnp::AnyPointer::Pipeline>::operator=
          (ExceptionOr<capnp::AnyPointer::Pipeline> *this,
          ExceptionOr<capnp::AnyPointer::Pipeline> *param_1)

{
  PipelineOp *pPVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  PipelineHook *pPVar4;
  Disposer *pDVar5;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pPVar1 = (this->value).ptr.field_1.value.ops.ptr;
      if (pPVar1 != (PipelineOp *)0x0) {
        sVar2 = (this->value).ptr.field_1.value.ops.size_;
        (this->value).ptr.field_1.value.ops.ptr = (PipelineOp *)0x0;
        (this->value).ptr.field_1.value.ops.size_ = 0;
        pAVar3 = (this->value).ptr.field_1.value.ops.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pPVar1,8,sVar2,sVar2,0);
      }
      pPVar4 = (this->value).ptr.field_1.value.hook.ptr;
      if (pPVar4 != (PipelineHook *)0x0) {
        (this->value).ptr.field_1.value.hook.ptr = (PipelineHook *)0x0;
        pDVar5 = (this->value).ptr.field_1.value.hook.disposer;
        (**pDVar5->_vptr_Disposer)
                  (pDVar5,pPVar4->_vptr_PipelineHook[-2] + (long)&pPVar4->_vptr_PipelineHook);
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      pPVar4 = (param_1->value).ptr.field_1.value.hook.ptr;
      (this->value).ptr.field_1.value.hook.disposer =
           (param_1->value).ptr.field_1.value.hook.disposer;
      (this->value).ptr.field_1.value.hook.ptr = pPVar4;
      (param_1->value).ptr.field_1.value.hook.ptr = (PipelineHook *)0x0;
      (this->value).ptr.field_1.value.ops.ptr = (param_1->value).ptr.field_1.value.ops.ptr;
      (this->value).ptr.field_1.value.ops.size_ = (param_1->value).ptr.field_1.value.ops.size_;
      (this->value).ptr.field_1.value.ops.disposer = (param_1->value).ptr.field_1.value.ops.disposer
      ;
      (param_1->value).ptr.field_1.value.ops.ptr = (PipelineOp *)0x0;
      (param_1->value).ptr.field_1.value.ops.size_ = 0;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;